

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O1

int unicode_decomp_entry(uint32_t *res,uint32_t c,int idx,uint32_t code,uint32_t len,uint32_t type)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  ushort *puVar4;
  ulong uVar5;
  ushort *puVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint32_t uVar13;
  
  uVar5 = (ulong)unicode_decomp_table2[idx];
  if (type == 0) {
    *res = (uint)unicode_decomp_table2[idx];
    return 1;
  }
  uVar8 = 0;
  if (0x21 < type - 1) {
    return 0;
  }
  puVar6 = (ushort *)(unicode_decomp_data + uVar5);
  switch(type) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    if (0 < (int)type) {
      uVar8 = 0;
      do {
        uVar2 = *(ushort *)(unicode_decomp_data + uVar8 * 2 + uVar5 + (c - code) * type * 2);
        res[uVar8] = (uint)uVar2;
        if (uVar2 == 0) {
          return 0;
        }
        uVar8 = uVar8 + 1;
      } while (type != uVar8);
    }
    break;
  case 8:
  case 9:
    uVar10 = type - 7;
    bVar3 = 7 < (int)type;
    type = uVar10;
    if (bVar3) {
      iVar11 = (c - code) * uVar10;
      uVar7 = iVar11 * 2;
      uVar5 = 0;
      do {
        uVar9 = (*(byte *)((long)puVar6 +
                          (ulong)(((uint)(iVar11 + (int)uVar5) >> 2) + len * uVar10 * 2)) >>
                 ((byte)uVar7 & 6) & 3) << 0x10 | (uint)*(ushort *)((long)puVar6 + (ulong)uVar7);
        if (uVar9 == 0) {
          return 0;
        }
        res[uVar5] = uVar9;
        uVar5 = uVar5 + 1;
        uVar7 = uVar7 + 2;
      } while (uVar10 != uVar5);
    }
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    uVar10 = type - 9;
    bVar3 = 9 < (int)type;
    type = uVar10;
    if (bVar3) {
      uVar5 = 0;
      do {
        bVar1 = *(byte *)((long)puVar6 + uVar5 + (c - code) * uVar10);
        uVar13 = (uint32_t)bVar1;
        if ((char)bVar1 < '\0') {
          if (bVar1 < 0xd0) {
            uVar13 = bVar1 + 0x280;
          }
          else {
            uVar13 = (uint32_t)
                     *(ushort *)
                      ((long)&unicode_get_short_code_unicode_short_table + (ulong)(bVar1 - 0xd0) * 2
                      );
          }
        }
        res[uVar5] = uVar13;
        if (uVar13 == 0) {
          return 0;
        }
        uVar5 = uVar5 + 1;
      } while (uVar10 != uVar5);
    }
    break;
  case 0xf:
    uVar10 = 1;
    goto LAB_0017731c;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    uVar10 = (type - 0x10 >> 1) + 2;
    uVar8 = (ulong)((uint)(2 < (int)uVar10) + (type & 1));
LAB_0017731c:
    type = uVar10;
    if (0 < (int)uVar10) {
      uVar12 = 0;
      do {
        iVar11 = 0;
        if (uVar8 == uVar12) {
          iVar11 = c - code;
        }
        res[uVar12] = iVar11 + (uint)*(ushort *)(unicode_decomp_data + uVar12 * 2 + uVar5);
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
    }
    break;
  default:
    uVar5 = (ulong)(type - 0x15);
    goto LAB_00177275;
  case 0x1e:
    uVar5 = 0x12;
LAB_00177275:
    type = (uint32_t)uVar5;
    if (0 < (int)type) {
      uVar2 = *puVar6;
      uVar8 = 0;
      do {
        bVar1 = *(byte *)((long)puVar6 + uVar8 + ((c - code) * type + 2));
        uVar13 = (uint)uVar2 + (uint)bVar1;
        if (bVar1 == 0xff) {
          uVar13 = 0x20;
        }
        res[uVar8] = uVar13;
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    break;
  case 0x1f:
    uVar8 = (ulong)((c - code) * 3);
    uVar10 = (uint)*(ushort *)((long)puVar6 + uVar8);
    *res = uVar10;
    if (uVar10 == 0) {
      return 0;
    }
    bVar1 = unicode_decomp_data[uVar8 + uVar5 + 2];
    goto LAB_001774f9;
  case 0x20:
    *res = (uint)*puVar6;
    res[2] = (uint)*(ushort *)(unicode_decomp_data + uVar5 + 2);
    res[1] = (uint)*(ushort *)((long)puVar6 + (ulong)((c - code) * 2 + 4));
    type = 3;
    break;
  case 0x21:
  case 0x22:
    uVar10 = c - code;
    if (type == 0x21) {
      bVar1 = *(byte *)((long)puVar6 + (ulong)(uVar10 & 0xfffffffe));
      uVar7 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        if (bVar1 < 0xd0) {
          uVar7 = bVar1 + 0x280;
        }
        else {
          uVar7 = (uint)*(ushort *)
                         ((long)&unicode_get_short_code_unicode_short_table +
                         (ulong)(bVar1 - 0xd0) * 2);
        }
      }
      puVar6 = (ushort *)((long)puVar6 + (ulong)(uVar10 & 0xfffffffe) + 1);
    }
    else {
      puVar4 = (ushort *)((ulong)((uVar10 >> 1) * 3) + (long)puVar6);
      puVar6 = puVar4 + 1;
      uVar7 = (uint)*puVar4;
    }
    if ((uVar10 & 1) != 0) {
      iVar11 = 1;
      if (uVar7 - 0x410 < 0x20) {
        iVar11 = 0x20;
      }
      if (uVar7 < 0x100) {
        iVar11 = 0x20;
      }
      uVar7 = iVar11 + uVar7;
    }
    *res = uVar7;
    bVar1 = (byte)*puVar6;
LAB_001774f9:
    uVar10 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      if (bVar1 < 0xd0) {
        uVar10 = uVar10 + 0x280;
      }
      else {
        uVar10 = (uint)*(ushort *)
                        ((long)&unicode_get_short_code_unicode_short_table +
                        (ulong)(uVar10 - 0xd0) * 2);
      }
    }
    res[1] = uVar10;
    type = 2;
  }
  return type;
}

Assistant:

static int unicode_decomp_entry(uint32_t *res, uint32_t c,
                                int idx, uint32_t code, uint32_t len,
                                uint32_t type)
{
    uint32_t c1;
    int l, i, p;
    const uint8_t *d;

    if (type == DECOMP_TYPE_C1) {
        res[0] = unicode_decomp_table2[idx];
        return 1;
    } else {
        d = unicode_decomp_data + unicode_decomp_table2[idx];
        switch(type) {
        case DECOMP_TYPE_L1:
        case DECOMP_TYPE_L2:
        case DECOMP_TYPE_L3:
        case DECOMP_TYPE_L4:
        case DECOMP_TYPE_L5:
        case DECOMP_TYPE_L6:
        case DECOMP_TYPE_L7:
            l = type - DECOMP_TYPE_L1 + 1;
            d += (c - code) * l * 2;
            for(i = 0; i < l; i++) {
                if ((res[i] = unicode_get16(d + 2 * i)) == 0)
                    return 0;
            }
            return l;
        case DECOMP_TYPE_LL1:
        case DECOMP_TYPE_LL2:
            {
                uint32_t k, p;
                l = type - DECOMP_TYPE_LL1 + 1;
                k = (c - code) * l;
                p = len * l * 2;
                for(i = 0; i < l; i++) {
                    c1 = unicode_get16(d + 2 * k) |
                        (((d[p + (k / 4)] >> ((k % 4) * 2)) & 3) << 16);
                    if (!c1)
                        return 0;
                    res[i] = c1;
                    k++;
                }
            }
            return l;
        case DECOMP_TYPE_S1:
        case DECOMP_TYPE_S2:
        case DECOMP_TYPE_S3:
        case DECOMP_TYPE_S4:
        case DECOMP_TYPE_S5:
            l = type - DECOMP_TYPE_S1 + 1;
            d += (c - code) * l;
            for(i = 0; i < l; i++) {
                if ((res[i] = unicode_get_short_code(d[i])) == 0)
                    return 0;
            }
            return l;
        case DECOMP_TYPE_I1:
            l = 1;
            p = 0;
            goto decomp_type_i;
        case DECOMP_TYPE_I2_0:
        case DECOMP_TYPE_I2_1:
        case DECOMP_TYPE_I3_1:
        case DECOMP_TYPE_I3_2:
        case DECOMP_TYPE_I4_1:
        case DECOMP_TYPE_I4_2:
            l = 2 + ((type - DECOMP_TYPE_I2_0) >> 1);
            p = ((type - DECOMP_TYPE_I2_0) & 1) + (l > 2);
        decomp_type_i:
            for(i = 0; i < l; i++) {
                c1 = unicode_get16(d + 2 * i);
                if (i == p)
                    c1 += c - code;
                res[i] = c1;
            }
            return l;
        case DECOMP_TYPE_B18:
            l = 18;
            goto decomp_type_b;
        case DECOMP_TYPE_B1:
        case DECOMP_TYPE_B2:
        case DECOMP_TYPE_B3:
        case DECOMP_TYPE_B4:
        case DECOMP_TYPE_B5:
        case DECOMP_TYPE_B6:
        case DECOMP_TYPE_B7:
        case DECOMP_TYPE_B8:
            l = type - DECOMP_TYPE_B1 + 1;
        decomp_type_b:
            {
                uint32_t c_min;
                c_min = unicode_get16(d);
                d += 2 + (c - code) * l;
                for(i = 0; i < l; i++) {
                    c1 = d[i];
                    if (c1 == 0xff)
                        c1 = 0x20;
                    else
                        c1 += c_min;
                    res[i] = c1;
                }
            }
            return l;
        case DECOMP_TYPE_LS2:
            d += (c - code) * 3;
            if (!(res[0] = unicode_get16(d)))
                return 0;
            res[1] = unicode_get_short_code(d[2]);
            return 2;
        case DECOMP_TYPE_PAT3:
            res[0] = unicode_get16(d);
            res[2] = unicode_get16(d + 2);
            d += 4 + (c - code) * 2;
            res[1] = unicode_get16(d);
            return 3;
        case DECOMP_TYPE_S2_UL:
        case DECOMP_TYPE_LS2_UL:
            c1 = c - code;
            if (type == DECOMP_TYPE_S2_UL) {
                d += c1 & ~1;
                c = unicode_get_short_code(*d);
                d++;
            } else {
                d += (c1 >> 1) * 3;
                c = unicode_get16(d);
                d += 2;
            }
            if (c1 & 1)
                c = unicode_get_lower_simple(c);
            res[0] = c;
            res[1] = unicode_get_short_code(*d);
            return 2;
        }
    }
    return 0;
}